

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

size_t SSL_get_client_random(SSL *ssl,uint8_t *out,size_t max_out)

{
  SSL *local_28;
  size_t max_out_local;
  uint8_t *out_local;
  SSL *ssl_local;
  
  if (max_out == 0) {
    ssl_local = (SSL *)0x20;
  }
  else {
    local_28 = (SSL *)max_out;
    if (0x20 < max_out) {
      local_28 = (SSL *)0x20;
    }
    OPENSSL_memcpy(out,ssl->s3->client_random,(size_t)local_28);
    ssl_local = local_28;
  }
  return (size_t)ssl_local;
}

Assistant:

size_t SSL_get_client_random(const SSL *ssl, uint8_t *out, size_t max_out) {
  if (max_out == 0) {
    return sizeof(ssl->s3->client_random);
  }
  if (max_out > sizeof(ssl->s3->client_random)) {
    max_out = sizeof(ssl->s3->client_random);
  }
  OPENSSL_memcpy(out, ssl->s3->client_random, max_out);
  return max_out;
}